

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

string * __thiscall
wasm::PassOptions::getArgumentOrDefault
          (string *__return_storage_ptr__,PassOptions *this,string *key,string *default_)

{
  bool bVar1;
  mapped_type *pmVar2;
  string local_48;
  string *local_28;
  string *default__local;
  string *key_local;
  PassOptions *this_local;
  
  local_28 = default_;
  default__local = key;
  key_local = (string *)this;
  this_local = (PassOptions *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_48,(string *)key);
  bVar1 = hasArgument(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->arguments,key);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)default_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getArgumentOrDefault(std::string key, std::string default_) {
    if (!hasArgument(key)) {
      return default_;
    }
    return arguments[key];
  }